

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_topal.c
# Opt level: O1

int gdImageTrueColorToPaletteSetMethod(gdImagePtr im,int method,int speed)

{
  int iVar1;
  int iVar2;
  
  iVar1 = 0;
  if ((method != 3) && (iVar1 = 1, (uint)method < 4)) {
    im->paletteQuantizationMethod = method;
    iVar2 = 0;
    if ((uint)speed < 0xb) {
      iVar2 = speed;
    }
    im->paletteQuantizationSpeed = iVar2;
  }
  return iVar1;
}

Assistant:

BGD_DECLARE(int) gdImageTrueColorToPaletteSetMethod (gdImagePtr im, int method, int speed)
{
#ifndef HAVE_LIBIMAGEQUANT
	if (method == GD_QUANT_LIQ) {
		return FALSE;
	}
#endif

	if (method >= GD_QUANT_DEFAULT && method <= GD_QUANT_LIQ) {
		im->paletteQuantizationMethod = method;

		if (speed < 0 || speed > 10) {
			speed = 0;
		}
		im->paletteQuantizationSpeed = speed;
	}
	return TRUE;
}